

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_ls.c
# Opt level: O0

int CVodeSetLinSysFn(void *cvode_mem,CVLsLinSysFn linsys)

{
  long in_RSI;
  int retval;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  CVodeMem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  CVodeMem local_20;
  int local_4;
  
  local_4 = cvLs_AccessLMem(in_stack_ffffffffffffffd8,
                            (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffc8,(CVLsMem *)0x1203c9);
  if (local_4 == 0) {
    if ((in_RSI == 0) || (*(long *)((long)in_stack_ffffffffffffffd8 + 0x50) != 0)) {
      if (in_RSI == 0) {
        *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 0x120) = 0;
        *(code **)((long)in_stack_ffffffffffffffd8 + 0x128) = cvLsLinSys;
        *(CVodeMem *)((long)in_stack_ffffffffffffffd8 + 0x130) = local_20;
      }
      else {
        *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 0x120) = 1;
        *(long *)((long)in_stack_ffffffffffffffd8 + 0x128) = in_RSI;
        *(void **)((long)in_stack_ffffffffffffffd8 + 0x130) = local_20->cv_user_data;
      }
      local_4 = 0;
    }
    else {
      cvProcessError(local_20,-3,0x23f,"CVodeSetLinSysFn",
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvode/cvode_ls.c"
                     ,"Linear system setup routine cannot be supplied for NULL SUNMatrix");
      local_4 = -3;
    }
  }
  return local_4;
}

Assistant:

int CVodeSetLinSysFn(void* cvode_mem, CVLsLinSysFn linsys)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  int retval;

  /* access CVLsMem structure */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* return with failure if linsys cannot be used */
  if ((linsys != NULL) && (cvls_mem->A == NULL))
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__,
                   __FILE__, "Linear system setup routine cannot be supplied for NULL SUNMatrix");
    return (CVLS_ILL_INPUT);
  }

  /* set the linear system routine pointer, and update relevant flags */
  if (linsys != NULL)
  {
    cvls_mem->user_linsys = SUNTRUE;
    cvls_mem->linsys      = linsys;
    cvls_mem->A_data      = cv_mem->cv_user_data;
  }
  else
  {
    cvls_mem->user_linsys = SUNFALSE;
    cvls_mem->linsys      = cvLsLinSys;
    cvls_mem->A_data      = cv_mem;
  }

  return (CVLS_SUCCESS);
}